

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoded_uint_vector.h
# Opt level: O1

void s2coding::EncodeUintWithLength<unsigned_long_long>
               (unsigned_long_long value,int length,Encoder *encoder)

{
  int iVar1;
  S2LogMessage SStack_28;
  
  if ((uint)length < 9) {
    if (encoder->limit_ < encoder->buf_) {
      S2LogMessage::S2LogMessage
                (&SStack_28,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/coding/coder.h"
                 ,0xf8,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                (SStack_28.stream_,"Check failed: (limit_) >= (buf_) ",0x21);
    }
    else if ((ulong)((long)encoder->limit_ - (long)encoder->buf_) < (ulong)(long)length) {
      S2LogMessage::S2LogMessage
                (&SStack_28,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/encoded_uint_vector.h"
                 ,0x86,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                (SStack_28.stream_,"Check failed: (encoder->avail()) >= (length) ",0x2d);
    }
    else {
      if (length != 0) {
        iVar1 = length + 1;
        do {
          Encoder::put8(encoder,(uchar)value);
          value = value >> 8;
          iVar1 = iVar1 + -1;
        } while (1 < iVar1);
      }
      if (value == 0) {
        return;
      }
      S2LogMessage::S2LogMessage
                (&SStack_28,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/encoded_uint_vector.h"
                 ,0x8c,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                (SStack_28.stream_,"Check failed: (value) == (0) ",0x1d);
    }
  }
  else {
    S2LogMessage::S2LogMessage
              (&SStack_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/encoded_uint_vector.h"
               ,0x85,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (SStack_28.stream_,"Check failed: length >= 0 && length <= sizeof(T) ",0x31);
  }
  abort();
}

Assistant:

inline void EncodeUintWithLength(T value, int length, Encoder* encoder) {
  static_assert(std::is_unsigned<T>::value, "Unsupported signed integer");
  static_assert(sizeof(T) & 0xe, "Unsupported integer length");
  S2_DCHECK(length >= 0 && length <= sizeof(T));
  S2_DCHECK_GE(encoder->avail(), length);

  while (--length >= 0) {
    encoder->put8(value);
    value >>= 8;
  }
  S2_DCHECK_EQ(value, 0);
}